

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

FieldType __thiscall
google::protobuf::internal::ExtensionSet::ExtensionType(ExtensionSet *this,int number)

{
  FieldType FVar1;
  Extension *pEVar2;
  LogMessage *pLVar3;
  LogFinisher local_49;
  LogMessage local_48;
  
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x110);
    pLVar3 = LogMessage::operator<<
                       (&local_48,"Don\'t lookup extension types if they aren\'t present (1). ");
    LogFinisher::operator=(&local_49,pLVar3);
    LogMessage::~LogMessage(&local_48);
    FVar1 = '\0';
  }
  else {
    if ((pEVar2->field_0xa & 1) != 0) {
      LogMessage::LogMessage
                (&local_48,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x114);
      pLVar3 = LogMessage::operator<<
                         (&local_48,"Don\'t lookup extension types if they aren\'t present (2). ");
      LogFinisher::operator=(&local_49,pLVar3);
      LogMessage::~LogMessage(&local_48);
    }
    FVar1 = pEVar2->type;
  }
  return FVar1;
}

Assistant:

FieldType ExtensionSet::ExtensionType(int number) const {
  const Extension* ext = FindOrNull(number);
  if (ext == nullptr) {
    GOOGLE_LOG(DFATAL) << "Don't lookup extension types if they aren't present (1). ";
    return 0;
  }
  if (ext->is_cleared) {
    GOOGLE_LOG(DFATAL) << "Don't lookup extension types if they aren't present (2). ";
  }
  return ext->type;
}